

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetwork.pb.cc
# Opt level: O0

void __thiscall CoreML::Specification::LoopLayerParams::SharedDtor(LoopLayerParams *this)

{
  string *default_value;
  LoopLayerParams *pLVar1;
  LoopLayerParams *this_local;
  
  default_value = google::protobuf::internal::GetEmptyStringAlreadyInited_abi_cxx11_();
  google::protobuf::internal::ArenaStringPtr::DestroyNoArena(&this->conditionvar_,default_value);
  pLVar1 = internal_default_instance();
  if ((this != pLVar1) && (this->conditionnetwork_ != (NeuralNetwork *)0x0)) {
    (*(this->conditionnetwork_->super_MessageLite)._vptr_MessageLite[1])();
  }
  pLVar1 = internal_default_instance();
  if ((this != pLVar1) && (this->bodynetwork_ != (NeuralNetwork *)0x0)) {
    (*(this->bodynetwork_->super_MessageLite)._vptr_MessageLite[1])();
  }
  return;
}

Assistant:

void LoopLayerParams::SharedDtor() {
  conditionvar_.DestroyNoArena(&::google::protobuf::internal::GetEmptyStringAlreadyInited());
  if (this != internal_default_instance()) {
    delete conditionnetwork_;
  }
  if (this != internal_default_instance()) {
    delete bodynetwork_;
  }
}